

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O2

int32_t llama_model_meta_val_str_by_index(llama_model *model,int32_t i,char *buf,size_t buf_size)

{
  int iVar1;
  const_iterator it;
  
  if ((i < 0) || ((int)(model->gguf_kv)._M_h._M_element_count <= i)) {
    iVar1 = -1;
    if (buf_size != 0) {
      *buf = '\0';
    }
  }
  else {
    it.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               )(model->gguf_kv)._M_h._M_before_begin._M_nxt;
    std::
    advance<std::__detail::_Node_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>,false,true>,int>
              (&it,i);
    iVar1 = snprintf(buf,buf_size,"%s",
                     *(undefined8 *)
                      ((long)it.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                             ._M_cur + 0x28));
  }
  return iVar1;
}

Assistant:

int32_t llama_model_meta_val_str_by_index(const llama_model * model, int32_t i, char * buf, size_t buf_size) {
    if (i < 0 || i >= (int)model->gguf_kv.size()) {
        if (buf_size > 0) {
            buf[0] = '\0';
        }
        return -1;
    }
    auto it = model->gguf_kv.begin();
    std::advance(it, i);
    return snprintf(buf, buf_size, "%s", it->second.c_str());
}